

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

CpuSet * ncnn::get_cpu_thread_affinity_mask(int powersave)

{
  CpuSet *pCVar1;
  
  try_initialize_global_cpu_info();
  if ((uint)powersave < 3) {
    pCVar1 = (CpuSet *)(&PTR_g_cpu_affinity_mask_all_0055e378)[(uint)powersave];
  }
  else {
    fprintf(_stderr,"powersave %d not supported",(ulong)(uint)powersave);
    fputc(10,_stderr);
    pCVar1 = &g_cpu_affinity_mask_all;
  }
  return pCVar1;
}

Assistant:

const CpuSet& get_cpu_thread_affinity_mask(int powersave)
{
    try_initialize_global_cpu_info();
    if (powersave == 0)
        return g_cpu_affinity_mask_all;

    if (powersave == 1)
        return g_cpu_affinity_mask_little;

    if (powersave == 2)
        return g_cpu_affinity_mask_big;

    NCNN_LOGE("powersave %d not supported", powersave);

    // fallback to all cores anyway
    return g_cpu_affinity_mask_all;
}